

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hxx
# Opt level: O0

void miniros::serialization::Serializer<rosgraph_msgs::Log_<std::allocator<void>>>::
     allInOne<miniros::serialization::LStream,rosgraph_msgs::Log_<std::allocator<void>>const&>
               (LStream *stream,Log_<std::allocator<void>_> *m)

{
  uint32_t uVar1;
  int *in_RDI;
  
  uVar1 = serializationLength<std_msgs::Header_<std::allocator<void>>>
                    ((Header_<std::allocator<void>_> *)0x4a1a49);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<signed_char>((char *)0x4a1a80);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a1ac3);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a1b06);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a1b49);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a1b88);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<unsigned_int>((uint *)0x4a1bcd);
  *in_RDI = uVar1 + *in_RDI;
  uVar1 = serializationLength<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x4a1c12);
  *in_RDI = uVar1 + *in_RDI;
  return;
}

Assistant:

inline static void allInOne(Stream& stream, T m)
    {
      stream.next(m.header);
      stream.next(m.level);
      stream.next(m.name);
      stream.next(m.msg);
      stream.next(m.file);
      stream.next(m.function);
      stream.next(m.line);
      stream.next(m.topics);
    }